

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseTemplateParam(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    bVar4 = ParseTwoCharToken(guard.state_,"T_");
    if (bVar4) {
      MaybeAppend(guard.state_,"?");
      state_local._7_1_ = true;
    }
    else {
      uVar1 = ((guard.state_)->parse_state).mangled_idx;
      uVar2 = ((guard.state_)->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
      bVar4 = ParseOneCharToken(guard.state_,'T');
      if (((bVar4) && (bVar4 = ParseNumber(guard.state_,(int *)0x0), bVar4)) &&
         (bVar4 = ParseOneCharToken(guard.state_,'_'), bVar4)) {
        MaybeAppend(guard.state_,"?");
        state_local._7_1_ = true;
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        bVar4 = ParseTwoCharToken(guard.state_,"TL");
        if ((bVar4) && (bVar4 = ParseNumber(guard.state_,(int *)0x0), bVar4)) {
          bVar4 = ParseTwoCharToken(guard.state_,"__");
          if (bVar4) {
            MaybeAppend(guard.state_,"?");
            state_local._7_1_ = true;
            goto LAB_0022f5d1;
          }
          bVar4 = ParseOneCharToken(guard.state_,'_');
          if (((bVar4) && (bVar4 = ParseNumber(guard.state_,(int *)0x0), bVar4)) &&
             (bVar4 = ParseOneCharToken(guard.state_,'_'), bVar4)) {
            MaybeAppend(guard.state_,"?");
            state_local._7_1_ = true;
            goto LAB_0022f5d1;
          }
        }
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        state_local._7_1_ = false;
      }
    }
  }
LAB_0022f5d1:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseTemplateParam(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTwoCharToken(state, "T_")) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;              // ::= T_
  }

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'T') && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;              // ::= T <parameter-2 non-negative number> _
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "TL") && ParseNumber(state, nullptr)) {
    if (ParseTwoCharToken(state, "__")) {
      MaybeAppend(state, "?");  // We don't support template substitutions.
      return true;              // ::= TL <level-1> __
    }

    if (ParseOneCharToken(state, '_') && ParseNumber(state, nullptr) &&
        ParseOneCharToken(state, '_')) {
      MaybeAppend(state, "?");  // We don't support template substitutions.
      return true;  // ::= TL <level-1> _ <parameter-2 non-negative number> _
    }
  }
  state->parse_state = copy;
  return false;
}